

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::~olc_db(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *this)

{
  __int_type_conflict _Var1;
  uint uVar2;
  qsbr *pqVar3;
  
  pqVar3 = qsbr::instance();
  _Var1 = (pqVar3->state).super___atomic_base<unsigned_long>._M_i;
  uVar2 = (uint)(_Var1 >> 0x20) & 0x3fffffff;
  if (uVar2 < ((uint)_Var1 & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if (uVar2 < 2) {
    delete_root_subtree(this);
    return;
  }
  __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x65a,
                "unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::~olc_db() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

olc_db<Key, Value>::~olc_db() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  delete_root_subtree();
}